

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

void __thiscall wasm::DAEFunctionInfo::clear(DAEFunctionInfo *this)

{
  DAEFunctionInfo local_120;
  
  memset(&local_120,0,0x108);
  DAEFunctionInfo(&local_120);
  operator=(this,&local_120);
  ~DAEFunctionInfo(&local_120);
  return;
}

Assistant:

void clear() { *this = DAEFunctionInfo(); }